

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

bool gmlc::utilities::nonNumericFirstOrLastCharacter(string_view V)

{
  bool bVar1;
  CharMapper<bool> *in_RDI;
  uchar keyChar;
  
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
  keyChar = true;
  if (!bVar1) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0,0);
    bVar1 = CharMapper<bool>::operator[](in_RDI,keyChar);
    keyChar = true;
    if (bVar1) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::back
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
      bVar1 = CharMapper<bool>::operator[](in_RDI,keyChar);
      keyChar = !bVar1;
    }
  }
  return (bool)keyChar;
}

Assistant:

inline bool nonNumericFirstOrLastCharacter(std::string_view V)
{
    return (
        (V.empty()) || (numCheck[V[0]] == false) ||
        (numCheckEnd[V.back()] == false));
}